

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleline.h
# Opt level: O0

void __thiscall bandit::reporter::singleline::print_status_line(singleline *this)

{
  ostream *poVar1;
  string local_60 [48];
  string local_30 [32];
  singleline *local_10;
  singleline *this_local;
  
  local_10 = this;
  std::operator<<((this->super_colored_base).stm_,'\r');
  poVar1 = std::operator<<((this->super_colored_base).stm_,"Executed ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->super_colored_base).super_progress_base.specs_run_);
  std::operator<<(poVar1," tests.");
  if ((this->super_colored_base).super_progress_base.specs_failed_ != 0) {
    poVar1 = std::operator<<((this->super_colored_base).stm_," ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->super_colored_base).super_progress_base.specs_succeeded_);
    poVar1 = std::operator<<(poVar1," succeeded. ");
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])();
    poVar1 = std::operator<<(poVar1,local_30);
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->super_colored_base).super_progress_base.specs_failed_);
    poVar1 = std::operator<<(poVar1," failed.");
    (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_60);
    std::operator<<(poVar1,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_30);
  }
  std::ostream::flush();
  return;
}

Assistant:

void print_status_line() {
        stm_ << '\r';
        stm_ << "Executed " << specs_run_ << " tests.";

        if (specs_failed_) {
          stm_
              << " " << specs_succeeded_ << " succeeded. "
              << colorizer_.bad() << specs_failed_ << " failed."
              << colorizer_.reset();
        }
        stm_.flush();
      }